

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameters.cpp
# Opt level: O2

bool __thiscall
DIS::DeadReckoningParameters::operator==(DeadReckoningParameters *this,DeadReckoningParameters *rhs)

{
  uchar idx;
  bool bVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = this->_deadReckoningAlgorithm == rhs->_deadReckoningAlgorithm;
  for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
    bVar4 = (bool)(bVar4 & this->_parameters[lVar3] == rhs->_parameters[lVar3]);
  }
  bVar1 = Vector3Float::operator==(&this->_entityLinearAcceleration,&rhs->_entityLinearAcceleration)
  ;
  bVar2 = Vector3Float::operator==(&this->_entityAngularVelocity,&rhs->_entityAngularVelocity);
  return (bool)((bVar2 && bVar1) & bVar4);
}

Assistant:

bool DeadReckoningParameters::operator ==(const DeadReckoningParameters& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_deadReckoningAlgorithm == rhs._deadReckoningAlgorithm) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 15; idx++)
     {
          if(!(_parameters[idx] == rhs._parameters[idx]) ) ivarsEqual = false;
     }

     if( ! (_entityLinearAcceleration == rhs._entityLinearAcceleration) ) ivarsEqual = false;
     if( ! (_entityAngularVelocity == rhs._entityAngularVelocity) ) ivarsEqual = false;

    return ivarsEqual;
 }